

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_typeSlotAtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  size_t slotIndex;
  
  if (argumentCount != 3) {
    context = (sysbvm_context_t *)0x3;
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  uVar1 = arguments[1];
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    sysbvm_error_nullArgument();
    uVar1 = arguments[1];
  }
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar1 = *(ulong *)(uVar1 + 0x48);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotIndex = (long)uVar1 >> 4;
    }
    else {
      slotIndex = *(size_t *)(uVar1 + 0x10);
    }
  }
  else {
    slotIndex = 0;
  }
  sysbvm_tuple_slotAtPut(context,*arguments,slotIndex,arguments[2]);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_typeSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) sysbvm_error_nullArgument();

    sysbvm_tuple_slotAtPut(context, arguments[0], sysbvm_typeSlot_getIndex(arguments[1]), arguments[2]);
    return SYSBVM_VOID_TUPLE;
}